

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hxx
# Opt level: O0

void __thiscall nuraft::context::~context(context *this)

{
  cb_func::~cb_func((cb_func *)0x4c7a4c);
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x4c7a5a);
  std::shared_ptr<nuraft::delayed_task_scheduler>::~shared_ptr
            ((shared_ptr<nuraft::delayed_task_scheduler> *)0x4c7a68);
  std::shared_ptr<nuraft::rpc_client_factory>::~shared_ptr
            ((shared_ptr<nuraft::rpc_client_factory> *)0x4c7a76);
  std::shared_ptr<nuraft::logger>::~shared_ptr((shared_ptr<nuraft::logger> *)0x4c7a84);
  std::shared_ptr<nuraft::rpc_listener>::~shared_ptr((shared_ptr<nuraft::rpc_listener> *)0x4c7a92);
  std::shared_ptr<nuraft::state_machine>::~shared_ptr((shared_ptr<nuraft::state_machine> *)0x4c7aa0)
  ;
  std::shared_ptr<nuraft::state_mgr>::~shared_ptr((shared_ptr<nuraft::state_mgr> *)0x4c7aaa);
  return;
}

Assistant:

context( ptr<state_mgr>& mgr,
             ptr<state_machine>& m,
             ptr<rpc_listener>& listener,
             ptr<logger>& l,
             ptr<rpc_client_factory>& cli_factory,
             ptr<delayed_task_scheduler>& scheduler,
             const raft_params& params )
        : state_mgr_(mgr)
        , state_machine_(m)
        , rpc_listener_(listener)
        , logger_(l)
        , rpc_cli_factory_(cli_factory)
        , scheduler_(scheduler)
        , params_( cs_new<raft_params>(params) )
        {}